

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void handle_ast_error(ParserContext *context,RuleType rule_type,rule_function action)

{
  int iVar1;
  jmp_buf env;
  __jmp_buf_tag _Stack_f8;
  
  if (context->stop_at_first_error != true) {
    iVar1 = _setjmp(&_Stack_f8);
    ErrorList_set_local_rescue_env(context->errors,(jmp_buf_conflict *)&_Stack_f8);
    if (iVar1 != 0) {
      return;
    }
  }
  (*action)(context->builder,rule_type);
  return;
}

Assistant:

static void handle_ast_error(ParserContext* context, RuleType rule_type, rule_function action) {
    if (context->stop_at_first_error) {
        action(context->builder, rule_type);
        return;
    }

    jmp_buf env;
    int val = setjmp(env);
    ErrorList_set_local_rescue_env(context->errors, &env);
    if (val == 0) {    
        action(context->builder, rule_type);
    }
}